

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MurmurHash2.cpp
# Opt level: O0

uint64_t MurmurHash64B(void *key,int len,uint64_t seed)

{
  uint uVar1;
  uint uVar2;
  uint32_t *puVar3;
  uint64_t h;
  uint32_t k1_1;
  uint32_t k2;
  uint32_t k1;
  uint32_t *data;
  uint32_t h2;
  uint32_t h1;
  int r;
  uint32_t m;
  uint64_t seed_local;
  int len_local;
  void *key_local;
  
  h1 = (uint)seed ^ len;
  h2 = (uint32_t)(seed >> 0x20);
  data = (uint32_t *)key;
  for (len_local = len; 7 < len_local; len_local = len_local + -8) {
    puVar3 = data + 1;
    h1 = (*data * 0x5bd1e995 >> 0x18 ^ *data * 0x5bd1e995) * 0x5bd1e995 ^ h1 * 0x5bd1e995;
    data = data + 2;
    h2 = (*puVar3 * 0x5bd1e995 >> 0x18 ^ *puVar3 * 0x5bd1e995) * 0x5bd1e995 ^ h2 * 0x5bd1e995;
  }
  if (3 < len_local) {
    h1 = (*data * 0x5bd1e995 >> 0x18 ^ *data * 0x5bd1e995) * 0x5bd1e995 ^ h1 * 0x5bd1e995;
    len_local = len_local + -4;
    data = data + 1;
  }
  if (len_local != 1) {
    if (len_local != 2) {
      if (len_local != 3) goto LAB_001be685;
      h2 = (uint)*(byte *)((long)data + 2) << 0x10 ^ h2;
    }
    h2 = (uint)*(byte *)((long)data + 1) << 8 ^ h2;
  }
  h2 = ((byte)*data ^ h2) * 0x5bd1e995;
LAB_001be685:
  uVar1 = (h2 >> 0x12 ^ h1) * 0x5bd1e995;
  uVar2 = (uVar1 >> 0x16 ^ h2) * 0x5bd1e995;
  uVar1 = (uVar2 >> 0x11 ^ uVar1) * 0x5bd1e995;
  return CONCAT44(uVar1,(uVar1 >> 0x13 ^ uVar2) * 0x5bd1e995);
}

Assistant:

uint64_t MurmurHash64B ( const void * key, int len, uint64_t seed )
{
  const uint32_t m = 0x5bd1e995;
  const int r = 24;

  uint32_t h1 = uint32_t(seed) ^ len;
  uint32_t h2 = uint32_t(seed >> 32);

  const uint32_t * data = (const uint32_t *)key;

  while(len >= 8)
  {
    uint32_t k1 = *data++;
    k1 *= m; k1 ^= k1 >> r; k1 *= m;
    h1 *= m; h1 ^= k1;
    len -= 4;

    uint32_t k2 = *data++;
    k2 *= m; k2 ^= k2 >> r; k2 *= m;
    h2 *= m; h2 ^= k2;
    len -= 4;
  }

  if(len >= 4)
  {
    uint32_t k1 = *data++;
    k1 *= m; k1 ^= k1 >> r; k1 *= m;
    h1 *= m; h1 ^= k1;
    len -= 4;
  }

  switch(len)
  {
  case 3: h2 ^= ((unsigned char*)data)[2] << 16;
  case 2: h2 ^= ((unsigned char*)data)[1] << 8;
  case 1: h2 ^= ((unsigned char*)data)[0];
      h2 *= m;
  };

  h1 ^= h2 >> 18; h1 *= m;
  h2 ^= h1 >> 22; h2 *= m;
  h1 ^= h2 >> 17; h1 *= m;
  h2 ^= h1 >> 19; h2 *= m;

  uint64_t h = h1;

  h = (h << 32) | h2;

  return h;
}